

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void copyvarinfo(rnnvarinfo *dst,rnnvarinfo *src)

{
  int iVar1;
  char *pcVar2;
  rnnvarset **pprVar3;
  rnnvarset *prVar4;
  int local_1c;
  int i;
  rnnvarinfo *src_local;
  rnnvarinfo *dst_local;
  
  memset(dst,0,0x40);
  if (src->prefix != (char *)0x0) {
    pcVar2 = strdup(src->prefix);
    dst->prefix = pcVar2;
  }
  if (src->prefixstr != (char *)0x0) {
    pcVar2 = strdup(src->prefixstr);
    dst->prefixstr = pcVar2;
  }
  if (src->varsetstr != (char *)0x0) {
    pcVar2 = strdup(src->varsetstr);
    dst->varsetstr = pcVar2;
  }
  if (src->variantsstr != (char *)0x0) {
    pcVar2 = strdup(src->variantsstr);
    dst->variantsstr = pcVar2;
  }
  dst->dead = src->dead;
  dst->prefenum = src->prefenum;
  for (local_1c = 0; local_1c < src->varsetsnum; local_1c = local_1c + 1) {
    if (dst->varsetsmax <= dst->varsetsnum) {
      if (dst->varsetsmax == 0) {
        dst->varsetsmax = 0x10;
      }
      else {
        dst->varsetsmax = dst->varsetsmax << 1;
      }
      pprVar3 = (rnnvarset **)realloc(dst->varsets,(long)dst->varsetsmax << 3);
      dst->varsets = pprVar3;
    }
    prVar4 = copyvarset(src->varsets[local_1c]);
    iVar1 = dst->varsetsnum;
    dst->varsetsnum = iVar1 + 1;
    dst->varsets[iVar1] = prVar4;
  }
  return;
}

Assistant:

static void copyvarinfo (struct rnnvarinfo *dst, struct rnnvarinfo *src) {
	int i;
	memset(dst, 0, sizeof(*dst));
	if (src->prefix)
		dst->prefix = strdup(src->prefix);
	if (src->prefixstr)
		dst->prefixstr = strdup(src->prefixstr);
	if (src->varsetstr)
		dst->varsetstr = strdup(src->varsetstr);
	if (src->variantsstr)
		dst->variantsstr = strdup(src->variantsstr);
	dst->dead = src->dead;
	dst->prefenum = src->prefenum;

	for (i = 0; i < src->varsetsnum; i++)
		ADDARRAY(dst->varsets, copyvarset(src->varsets[i]));
}